

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dyndep_parser.cc
# Opt level: O1

bool __thiscall DyndepParser::ParseDyndepVersion(DyndepParser *this,string *err)

{
  bool bVar1;
  int iVar2;
  long *plVar3;
  long *plVar4;
  size_type *psVar5;
  int minor;
  int major;
  string version;
  string name;
  EvalString let_value;
  int local_f0;
  int local_ec;
  string local_e8;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  string local_a8;
  long *local_88 [2];
  long local_78 [2];
  string local_68;
  EvalString local_48;
  
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_48.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  bVar1 = ParseLet(this,&local_68,&local_48,err);
  if (bVar1) {
    iVar2 = std::__cxx11::string::compare((char *)&local_68);
    if (iVar2 == 0) {
      EvalString::Evaluate_abi_cxx11_(&local_e8,&local_48,&(this->env_).super_Env);
      ParseVersion(&local_e8,&local_ec,&local_f0);
      if ((local_ec != 1) || (bVar1 = true, local_f0 != 0)) {
        local_88[0] = local_78;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_88,"unsupported \'ninja_dyndep_version = ","");
        plVar3 = (long *)std::__cxx11::string::_M_append
                                   ((char *)local_88,(ulong)local_e8._M_dataplus._M_p);
        local_c8 = &local_b8;
        plVar4 = plVar3 + 2;
        if ((long *)*plVar3 == plVar4) {
          local_b8 = *plVar4;
          lStack_b0 = plVar3[3];
        }
        else {
          local_b8 = *plVar4;
          local_c8 = (long *)*plVar3;
        }
        local_c0 = plVar3[1];
        *plVar3 = (long)plVar4;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_c8);
        psVar5 = (size_type *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar5) {
          local_a8.field_2._M_allocated_capacity = *psVar5;
          local_a8.field_2._8_8_ = plVar3[3];
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        }
        else {
          local_a8.field_2._M_allocated_capacity = *psVar5;
          local_a8._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_a8._M_string_length = plVar3[1];
        *plVar3 = (long)psVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        bVar1 = Lexer::Error(&(this->super_Parser).lexer_,&local_a8,err);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8,local_b8 + 1);
        }
        if (local_88[0] != local_78) {
          operator_delete(local_88[0],local_78[0] + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p == &local_e8.field_2) goto LAB_001101f6;
    }
    else {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e8,"expected \'ninja_dyndep_version = ...\'","");
      bVar1 = Lexer::Error(&(this->super_Parser).lexer_,&local_e8,err);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p == &local_e8.field_2) goto LAB_001101f6;
    }
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  else {
    bVar1 = false;
  }
LAB_001101f6:
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector(&local_48.parsed_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return bVar1;
}

Assistant:

bool DyndepParser::ParseDyndepVersion(string* err) {
  string name;
  EvalString let_value;
  if (!ParseLet(&name, &let_value, err))
    return false;
  if (name != "ninja_dyndep_version") {
    return lexer_.Error("expected 'ninja_dyndep_version = ...'", err);
  }
  string version = let_value.Evaluate(&env_);
  int major, minor;
  ParseVersion(version, &major, &minor);
  if (major != 1 || minor != 0) {
    return lexer_.Error(
      string("unsupported 'ninja_dyndep_version = ") + version + "'", err);
    return false;
  }
  return true;
}